

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_link_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
::compute_link_edges
          (Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *this,Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 *parent_complex,Simplex *alpha_parent_address,bool is_alpha_blocker)

{
  type_conflict1 tVar1;
  bool bVar2;
  int iVar3;
  reference local;
  Root_vertex_handle RVar4;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *lhs;
  reference_type_of_temporary_wrapper pVVar5;
  Edge_handle local_1c8;
  boost_vertex_handle local_1ac;
  Vertex_handle local_1a8;
  boost_vertex_handle local_1a4;
  boost_vertex_handle local_1a0;
  boost_vertex_handle local_19c;
  reference local_198;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *blocker_parent;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __end0;
  Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __begin0;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  local_178;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  *local_168;
  Const_complex_blocker_around_vertex_range *__range6;
  boost_vertex_handle local_158;
  boost_vertex_handle bStack_154;
  bool new_edge;
  boost_vertex_handle local_150;
  boost_vertex_handle local_14c;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_148;
  Vertex_handle local_140;
  Vertex_handle y_parent;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> local_124;
  Vertex_handle local_11c;
  undefined1 local_118 [4];
  Vertex_handle x_parent;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_e8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *local_d0;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  y_link;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_88;
  iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_70;
  undefined1 local_40 [8];
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  x_link;
  bool is_alpha_blocker_local;
  Simplex *alpha_parent_address_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *parent_complex_local;
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *this_local;
  
  x_link.vertexIterator.second.m_value._7_1_ = is_alpha_blocker;
  iVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
          ::num_vertices((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                          *)this);
  if (1 < iVar3) {
    Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
    ::vertex_range((Complex_vertex_range *)&local_70,
                   (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                    *)this);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::begin((Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
             *)local_40,&local_70);
    while( true ) {
      Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
      ::vertex_range((Complex_vertex_range *)&y_link.vertexIterator.second,
                     (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                      *)this);
      boost::iterator_range_detail::
      iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
      ::end(&local_88,
            (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
             *)&y_link.vertexIterator.second);
      tVar1 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                          *)local_40,
                         (iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                          *)&local_88);
      if (!tVar1) break;
      local_d0 = (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  *)local_40;
      y_link.complex = x_link.complex;
      y_link.vertexIterator.first = x_link.vertexIterator.first;
      while( true ) {
        lhs = boost::iterators::detail::
              iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
              ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                            *)&local_d0);
        Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
        ::vertex_range((Complex_vertex_range *)local_118,
                       (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                        *)this);
        boost::iterator_range_detail::
        iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
        ::end(&local_e8,
              (iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
               *)local_118);
        tVar1 = boost::iterators::operator!=
                          ((iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                            *)lhs,(iterator_facade<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                                   *)&local_e8);
        if (!tVar1) break;
        local = boost::iterators::detail::
                iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                             *)local_40);
        RVar4 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                ::get_id((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                          *)this,local.vertex);
        (*parent_complex->_vptr_Skeleton_blocker_complex[3])
                  (&local_124,parent_complex,(ulong)(uint)RVar4.vertex);
        pVVar5 = boost::
                 optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
                 operator*(&local_124);
        local_11c.vertex = pVVar5->vertex;
        boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
        ~optional(&local_124);
        local_150 = (boost_vertex_handle)
                    boost::iterators::detail::
                    iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                    ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                                 *)&local_d0);
        local_14c = (boost_vertex_handle)
                    Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                    ::get_id((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                              *)this,(Vertex_handle)local_150);
        (*parent_complex->_vptr_Skeleton_blocker_complex[3])
                  (&local_148,parent_complex,(ulong)(uint)local_14c);
        pVVar5 = boost::
                 optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
                 operator*(&local_148);
        local_140.vertex = pVVar5->vertex;
        boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
        ~optional(&local_148);
        bStack_154 = local_11c.vertex;
        local_158 = local_140.vertex;
        bVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                ::contains_edge(parent_complex,local_11c,local_140);
        if (bVar2) {
          __range6._7_1_ = 1;
          local_178 = (iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                       )Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                        ::const_blocker_range(parent_complex,local_11c);
          local_168 = &local_178;
          __end0 = boost::iterator_range_detail::
                   iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                   ::begin(local_168);
          blocker_parent =
               (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                *)boost::iterator_range_detail::
                  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                  ::end(local_168);
          while (tVar1 = boost::iterators::operator!=
                                   ((iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                     *)&__end0,
                                    (iterator_facade<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long>
                                     *)&blocker_parent), tVar1) {
            local_198 = boost::iterators::detail::
                        iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                        ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                                     *)&__end0);
            if (((x_link.vertexIterator.second.m_value._7_1_ & 1) == 0) ||
               (bVar2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                        ::operator!=(local_198,alpha_parent_address), bVar2)) {
              local_19c = local_140.vertex;
              bVar2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                      ::contains(local_198,(Vertex_handle)local_140.vertex);
              if (bVar2) {
                local_1a0 = local_11c.vertex;
                local_1a4 = local_140.vertex;
                bVar2 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                        ::contains_difference
                                  (alpha_parent_address,local_198,(Vertex_handle)local_11c.vertex,
                                   (Vertex_handle)local_140.vertex);
                __range6._7_1_ = (bVar2 ^ 0xffU) & 1;
                if (__range6._7_1_ == 0) break;
              }
            }
            boost::iterators::detail::
            iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
            ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const,_long,_false,_false>
                          *)&__end0);
          }
          if ((__range6._7_1_ & 1) != 0) {
            local_1a8.vertex =
                 (boost_vertex_handle)
                 boost::iterators::detail::
                 iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                 ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                              *)local_40);
            local_1ac = (boost_vertex_handle)
                        boost::iterators::detail::
                        iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                        ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                                     *)&local_d0);
            Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
            ::add_edge_without_blockers
                      (&local_1c8,
                       (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                        *)this,local_1a8,(Vertex_handle)local_1ac);
          }
        }
      }
      boost::iterators::detail::
      iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                    *)local_40);
    }
  }
  return;
}

Assistant:

void compute_link_edges(const ComplexType & parent_complex,
                          const Simplex& alpha_parent_address,
                          bool is_alpha_blocker = false) {
    if (this->num_vertices() <= 1)
      return;

    for (auto x_link = this->vertex_range().begin();
         x_link != this->vertex_range().end(); ++x_link) {
      for (auto y_link = x_link; ++y_link != this->vertex_range().end();) {
        Vertex_handle x_parent = *parent_complex.get_address(
                                                             this->get_id(*x_link));
        Vertex_handle y_parent = *parent_complex.get_address(
                                                             this->get_id(*y_link));
        if (parent_complex.contains_edge(x_parent, y_parent)) {
          // we check that there is no blocker subset of alpha passing through x and y
          bool new_edge = true;
          for (auto blocker_parent : parent_complex.const_blocker_range(
                                                                        x_parent)) {
            if (!is_alpha_blocker || *blocker_parent != alpha_parent_address) {
              if (blocker_parent->contains(y_parent)) {
                new_edge = !(alpha_parent_address.contains_difference(
                                                                     *blocker_parent, x_parent, y_parent));
                if (!new_edge)
                  break;
              }
            }
          }
          if (new_edge)
            this->add_edge_without_blockers(*x_link, *y_link);
        }
      }
    }
  }